

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,Request *req)

{
  ostream *poVar1;
  string *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Method: ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Path: ");
  poVar1 = std::operator<<(poVar1,in_RSI + 0x20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Protocol: ");
  poVar1 = std::operator<<(poVar1,in_RSI + 0x40);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Host: ");
  std::operator<<(poVar1,in_RSI + 0x60);
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const Request& req) {
    stream << "Method: "   << req.method  << std::endl
           << "Path: "     << req.path << std::endl
           << "Protocol: " << req.protocol << std::endl
           << "Host: "     << req.host;

    return stream;
}